

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_ts.cpp
# Opt level: O0

string * __thiscall
flatbuffers::ts::TsGenerator::GenUnionConvFuncName_abi_cxx11_
          (string *__return_storage_ptr__,TsGenerator *this,EnumDef *enum_def)

{
  allocator<char> local_41;
  string local_40;
  EnumDef *local_20;
  EnumDef *enum_def_local;
  TsGenerator *this_local;
  
  local_20 = enum_def;
  enum_def_local = (EnumDef *)this;
  this_local = (TsGenerator *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"unionTo",&local_41);
  IdlNamer::Function(__return_storage_ptr__,&this->namer_,&local_40,&local_20->super_Definition);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  return __return_storage_ptr__;
}

Assistant:

std::string GenUnionConvFuncName(const EnumDef &enum_def) {
    return namer_.Function("unionTo", enum_def);
  }